

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_conductor.hpp
# Opt level: O1

void __thiscall RoughConductorBRDF::RoughConductorBRDF(RoughConductorBRDF *this,Json *conf)

{
  size_t __n;
  RoughConductorBRDF *pRVar1;
  Json *this_00;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  undefined8 *puVar5;
  long lVar6;
  vec3f vVar7;
  const_iterator result;
  float ret;
  string name;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  long *local_68;
  size_t local_60;
  long local_58 [2];
  RoughConductorBRDF *local_48;
  Json *local_40;
  long *local_38;
  
  *(undefined4 *)&this->field_0x30 = 2;
  (this->super_BRDF)._vptr_BRDF = (_func_int **)0x16ca58;
  *(undefined8 *)&this->field_0x28 = 0x16ca88;
  *(undefined8 *)&(this->super_BRDF).field_0x8 = 0;
  *(undefined8 *)&(this->super_BRDF).field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Cu","");
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[9]>
            ((const_iterator *)&local_88,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              *)conf,(char (*) [9])0x1598f0);
  local_a8.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_a8.m_it.array_iterator._M_current = (pointer)0x0;
  local_a8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  if (conf->m_type == array) {
    local_a8.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else if (conf->m_type == object) {
    local_a8.m_it.object_iterator._M_node =
         &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_a8.m_it.primitive_iterator.m_it = 1;
  }
  local_a8.m_object = conf;
  bVar2 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_88,&local_a8);
  if (!bVar2) {
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"material");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_88,pvVar4);
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_) !=
        &local_88.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_),
                      (ulong)(local_88.field_2._M_allocated_capacity + 1));
    }
  }
  local_40 = conf;
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"roughness");
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
            (pvVar4,(float *)&local_88);
  this->alpha = local_88._M_dataplus._M_p._0_4_;
  local_38 = local_68;
  lVar6 = 0;
  bVar2 = false;
  local_48 = this;
  do {
    __n = *(size_t *)((long)&complexIorList[0].name._M_string_length + lVar6);
    if ((__n == local_60) &&
       ((__n == 0 ||
        (iVar3 = bcmp(*(void **)((long)&complexIorList[0].name._M_dataplus._M_p + lVar6),local_38,
                      __n), iVar3 == 0)))) {
      *(undefined4 *)&(this->super_BRDF).field_0x10 =
           *(undefined4 *)((long)&complexIorList[0].eta.z + lVar6);
      *(undefined8 *)&(this->super_BRDF).field_0x8 =
           *(undefined8 *)((long)&complexIorList[0].eta.x + lVar6);
      *(undefined4 *)&this->field_0x1c = *(undefined4 *)((long)&complexIorList[0].k.z + lVar6);
      *(undefined8 *)&(this->super_BRDF).field_0x14 =
           *(undefined8 *)((long)&complexIorList[0].k.x + lVar6);
      bVar2 = true;
    }
    this_00 = local_40;
    lVar6 = lVar6 + 0x38;
  } while (lVar6 != 0x8c0);
  if (!bVar2) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "conductor material not found";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[4]>
            ((const_iterator *)&local_88,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              *)local_40,(char (*) [4])"eta");
  pRVar1 = local_48;
  local_a8.m_object = this_00;
  local_a8.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_a8.m_it.array_iterator._M_current = (pointer)0x0;
  local_a8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  if (this_00->m_type == array) {
    local_a8.m_it.array_iterator._M_current =
         (((this_00->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else if (this_00->m_type == object) {
    local_a8.m_it.object_iterator._M_node =
         &(((this_00->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_a8.m_it.primitive_iterator.m_it = 1;
  }
  bVar2 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_88,&local_a8);
  if (!bVar2) {
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)this_00,"eta");
    vVar7 = json2vec3f(pvVar4);
    *(long *)&(pRVar1->super_BRDF).field_0x8 = vVar7._0_8_;
    *(float *)&(pRVar1->super_BRDF).field_0x10 = vVar7.z;
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[2]>
            ((const_iterator *)&local_88,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              *)this_00,(char (*) [2])"k");
  local_a8.m_object = this_00;
  local_a8.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_a8.m_it.array_iterator._M_current = (pointer)0x0;
  local_a8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  if (this_00->m_type == array) {
    local_a8.m_it.array_iterator._M_current =
         (((this_00->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else if (this_00->m_type == object) {
    local_a8.m_it.object_iterator._M_node =
         &(((this_00->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_a8.m_it.primitive_iterator.m_it = 1;
  }
  bVar2 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_88,&local_a8);
  if (!bVar2) {
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)this_00,"k");
    vVar7 = json2vec3f(pvVar4);
    *(long *)&(pRVar1->super_BRDF).field_0x14 = vVar7._0_8_;
    *(float *)&pRVar1->field_0x1c = vVar7.z;
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return;
}

Assistant:

RoughConductorBRDF(const Json& conf)
	{
		std::string name = "Cu";
		if (conf.find("material") != conf.end())
			name = conf["material"];
		alpha = conf["roughness"];
		bool found = false;
		for (int i=0; i<ComplexIorCount; ++i)
			if (complexIorList[i].name == name) {
				found = true;
				eta = complexIorList[i].eta;
				k = complexIorList[i].k;
			}
		if (!found) throw "conductor material not found";
		if (conf.find("eta") != conf.end())
			eta = json2vec3f(conf["eta"]);
		if (conf.find("k") != conf.end())
			k = json2vec3f(conf["k"]);
	}